

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feat.c
# Opt level: O0

void feat_s2_4x_cep2feat(feat_t *fcb,mfcc_t **mfc,mfcc_t **feat)

{
  mfcc_t *pmVar1;
  mfcc_t *pmVar2;
  mfcc_t *pmVar3;
  mfcc_t *pmVar4;
  mfcc_t *pmVar5;
  int local_68;
  int local_64;
  int32 j;
  int32 i;
  mfcc_t d2;
  mfcc_t d1;
  mfcc_t *_w_1;
  mfcc_t *_w1;
  mfcc_t *w_1;
  mfcc_t *w1;
  mfcc_t *_w;
  mfcc_t *w;
  mfcc_t *f;
  mfcc_t **feat_local;
  mfcc_t **mfc_local;
  feat_t *fcb_local;
  
  if (fcb == (feat_t *)0x0) {
    __assert_fail("fcb",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/feat/feat.c"
                  ,0x1b1,"void feat_s2_4x_cep2feat(feat_t *, mfcc_t **, mfcc_t **)");
  }
  if (fcb->cepsize != 0xd) {
    __assert_fail("feat_cepsize(fcb) == 13",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/feat/feat.c"
                  ,0x1b2,"void feat_s2_4x_cep2feat(feat_t *, mfcc_t **, mfcc_t **)");
  }
  if (fcb->n_stream != 4) {
    __assert_fail("feat_n_stream(fcb) == 4",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/feat/feat.c"
                  ,0x1b3,"void feat_s2_4x_cep2feat(feat_t *, mfcc_t **, mfcc_t **)");
  }
  if (*fcb->stream_len != 0xc) {
    __assert_fail("feat_stream_len(fcb, 0) == 12",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/feat/feat.c"
                  ,0x1b4,"void feat_s2_4x_cep2feat(feat_t *, mfcc_t **, mfcc_t **)");
  }
  if (fcb->stream_len[1] != 0x18) {
    __assert_fail("feat_stream_len(fcb, 1) == 24",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/feat/feat.c"
                  ,0x1b5,"void feat_s2_4x_cep2feat(feat_t *, mfcc_t **, mfcc_t **)");
  }
  if (fcb->stream_len[2] != 3) {
    __assert_fail("feat_stream_len(fcb, 2) == 3",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/feat/feat.c"
                  ,0x1b6,"void feat_s2_4x_cep2feat(feat_t *, mfcc_t **, mfcc_t **)");
  }
  if (fcb->stream_len[3] != 0xc) {
    __assert_fail("feat_stream_len(fcb, 3) == 12",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/feat/feat.c"
                  ,0x1b7,"void feat_s2_4x_cep2feat(feat_t *, mfcc_t **, mfcc_t **)");
  }
  if (fcb->window_size == 4) {
    memcpy(*feat,*mfc + 1,(long)(fcb->cepsize + -1) << 2);
    pmVar1 = mfc[2];
    pmVar2 = mfc[-2];
    pmVar3 = feat[1];
    for (local_64 = 0; local_64 < fcb->cepsize + -1; local_64 = local_64 + 1) {
      pmVar3[local_64] =
           (mfcc_t)((float)pmVar1[(long)local_64 + 1] - (float)pmVar2[(long)local_64 + 1]);
    }
    pmVar1 = mfc[4];
    pmVar2 = mfc[-4];
    for (local_68 = 0; local_68 < fcb->cepsize + -1; local_68 = local_68 + 1) {
      pmVar3[local_64] =
           (mfcc_t)((float)pmVar1[(long)local_68 + 1] - (float)pmVar2[(long)local_68 + 1]);
      local_64 = local_64 + 1;
    }
    pmVar1 = mfc[3];
    pmVar2 = mfc[-1];
    pmVar3 = mfc[1];
    pmVar4 = mfc[-3];
    pmVar5 = feat[3];
    for (local_64 = 0; local_64 < fcb->cepsize + -1; local_64 = local_64 + 1) {
      pmVar5[local_64] =
           (mfcc_t)(((float)pmVar1[(long)local_64 + 1] - (float)pmVar2[(long)local_64 + 1]) -
                   ((float)pmVar3[(long)local_64 + 1] - (float)pmVar4[(long)local_64 + 1]));
    }
    pmVar1 = feat[2];
    *pmVar1 = **mfc;
    pmVar1[1] = (mfcc_t)((float)*mfc[2] - (float)*mfc[-2]);
    pmVar1[2] = (mfcc_t)(((float)*mfc[3] - (float)*mfc[-1]) - ((float)*mfc[1] - (float)*mfc[-3]));
    return;
  }
  __assert_fail("feat_window_size(fcb) == 4",
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/feat/feat.c"
                ,0x1b8,"void feat_s2_4x_cep2feat(feat_t *, mfcc_t **, mfcc_t **)");
}

Assistant:

static void
feat_s2_4x_cep2feat(feat_t * fcb, mfcc_t ** mfc, mfcc_t ** feat)
{
    mfcc_t *f;
    mfcc_t *w, *_w;
    mfcc_t *w1, *w_1, *_w1, *_w_1;
    mfcc_t d1, d2;
    int32 i, j;

    assert(fcb);
    assert(feat_cepsize(fcb) == 13);
    assert(feat_n_stream(fcb) == 4);
    assert(feat_stream_len(fcb, 0) == 12);
    assert(feat_stream_len(fcb, 1) == 24);
    assert(feat_stream_len(fcb, 2) == 3);
    assert(feat_stream_len(fcb, 3) == 12);
    assert(feat_window_size(fcb) == 4);

    /* CEP; skip C0 */
    memcpy(feat[0], mfc[0] + 1, (feat_cepsize(fcb) - 1) * sizeof(mfcc_t));

    /*
     * DCEP(SHORT): mfc[2] - mfc[-2]
     * DCEP(LONG):  mfc[4] - mfc[-4]
     */
    w = mfc[2] + 1;             /* +1 to skip C0 */
    _w = mfc[-2] + 1;

    f = feat[1];
    for (i = 0; i < feat_cepsize(fcb) - 1; i++) /* Short-term */
        f[i] = w[i] - _w[i];

    w = mfc[4] + 1;             /* +1 to skip C0 */
    _w = mfc[-4] + 1;

    for (j = 0; j < feat_cepsize(fcb) - 1; i++, j++)    /* Long-term */
        f[i] = w[j] - _w[j];

    /* D2CEP: (mfc[3] - mfc[-1]) - (mfc[1] - mfc[-3]) */
    w1 = mfc[3] + 1;            /* Final +1 to skip C0 */
    _w1 = mfc[-1] + 1;
    w_1 = mfc[1] + 1;
    _w_1 = mfc[-3] + 1;

    f = feat[3];
    for (i = 0; i < feat_cepsize(fcb) - 1; i++) {
        d1 = w1[i] - _w1[i];
        d2 = w_1[i] - _w_1[i];

        f[i] = d1 - d2;
    }

    /* POW: C0, DC0, D2C0; differences computed as above for rest of cep */
    f = feat[2];
    f[0] = mfc[0][0];
    f[1] = mfc[2][0] - mfc[-2][0];

    d1 = mfc[3][0] - mfc[-1][0];
    d2 = mfc[1][0] - mfc[-3][0];
    f[2] = d1 - d2;
}